

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ze_valddi.cpp
# Opt level: O0

ze_result_t validation_layer::zeEventPoolCloseIpcHandle(ze_event_pool_handle_t hEventPool)

{
  code *pcVar1;
  ze_result_t zVar2;
  ze_result_t result_00;
  element_type *this;
  size_type sVar3;
  reference ppvVar4;
  pointer this_00;
  size_type sStack_80;
  ze_result_t result_2;
  size_t i_1;
  ze_result_t driver_result;
  ze_result_t result_1;
  ze_result_t result;
  size_t i;
  size_type numValHandlers;
  ze_pfnEventPoolCloseIpcHandle_t pfnCloseIpcHandle;
  allocator local_39;
  string local_38 [32];
  ze_event_pool_handle_t local_18;
  ze_event_pool_handle_t hEventPool_local;
  
  local_18 = hEventPool;
  this = std::__shared_ptr_access<loader::Logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
         operator->((__shared_ptr_access<loader::Logger,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                    )(context + 0xd50));
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_38,"zeEventPoolCloseIpcHandle(hEventPool)",&local_39);
  loader::Logger::log_trace(this,(string *)local_38);
  std::__cxx11::string::~string(local_38);
  std::allocator<char>::~allocator((allocator<char> *)&local_39);
  pcVar1 = *(code **)(context + 0x480);
  if (pcVar1 == (code *)0x0) {
    hEventPool_local._4_4_ =
         logAndPropagateResult("zeEventPoolCloseIpcHandle",ZE_RESULT_ERROR_UNSUPPORTED_FEATURE);
  }
  else {
    sVar3 = std::
            vector<validation_layer::validationChecker_*,_std::allocator<validation_layer::validationChecker_*>_>
            ::size((vector<validation_layer::validationChecker_*,_std::allocator<validation_layer::validationChecker_*>_>
                    *)(context + 0xd30));
    for (_result_1 = 0; _result_1 < sVar3; _result_1 = _result_1 + 1) {
      ppvVar4 = std::
                vector<validation_layer::validationChecker_*,_std::allocator<validation_layer::validationChecker_*>_>
                ::operator[]((vector<validation_layer::validationChecker_*,_std::allocator<validation_layer::validationChecker_*>_>
                              *)(context + 0xd30),_result_1);
      zVar2 = (*(*ppvVar4)->zeValidation->_vptr_ZEValidationEntryPoints[0x86])
                        ((*ppvVar4)->zeValidation,local_18);
      if (zVar2 != ZE_RESULT_SUCCESS) {
        zVar2 = logAndPropagateResult("zeEventPoolCloseIpcHandle",zVar2);
        return zVar2;
      }
    }
    if ((*(byte *)(context + 4) & 1) != 0) {
      this_00 = std::
                unique_ptr<validation_layer::HandleLifetimeValidation,_std::default_delete<validation_layer::HandleLifetimeValidation>_>
                ::operator->((unique_ptr<validation_layer::HandleLifetimeValidation,_std::default_delete<validation_layer::HandleLifetimeValidation>_>
                              *)(context + 0xd48));
      zVar2 = ZEHandleLifetimeValidation::zeEventPoolCloseIpcHandlePrologue
                        (&this_00->zeHandleLifetime,local_18);
      if (zVar2 != ZE_RESULT_SUCCESS) {
        zVar2 = logAndPropagateResult("zeEventPoolCloseIpcHandle",zVar2);
        return zVar2;
      }
    }
    zVar2 = (*pcVar1)(local_18);
    for (sStack_80 = 0; sStack_80 < sVar3; sStack_80 = sStack_80 + 1) {
      ppvVar4 = std::
                vector<validation_layer::validationChecker_*,_std::allocator<validation_layer::validationChecker_*>_>
                ::operator[]((vector<validation_layer::validationChecker_*,_std::allocator<validation_layer::validationChecker_*>_>
                              *)(context + 0xd30),sStack_80);
      result_00 = (*(*ppvVar4)->zeValidation->_vptr_ZEValidationEntryPoints[0x87])
                            ((*ppvVar4)->zeValidation,local_18,(ulong)zVar2);
      if (result_00 != ZE_RESULT_SUCCESS) {
        zVar2 = logAndPropagateResult("zeEventPoolCloseIpcHandle",result_00);
        return zVar2;
      }
    }
    hEventPool_local._4_4_ = logAndPropagateResult("zeEventPoolCloseIpcHandle",zVar2);
  }
  return hEventPool_local._4_4_;
}

Assistant:

__zedlllocal ze_result_t ZE_APICALL
    zeEventPoolCloseIpcHandle(
        ze_event_pool_handle_t hEventPool               ///< [in][release] handle of event pool object
        )
    {
        context.logger->log_trace("zeEventPoolCloseIpcHandle(hEventPool)");

        auto pfnCloseIpcHandle = context.zeDdiTable.EventPool.pfnCloseIpcHandle;

        if( nullptr == pfnCloseIpcHandle )
            return logAndPropagateResult("zeEventPoolCloseIpcHandle", ZE_RESULT_ERROR_UNSUPPORTED_FEATURE);

        auto numValHandlers = context.validationHandlers.size();
        for (size_t i = 0; i < numValHandlers; i++) {
            auto result = context.validationHandlers[i]->zeValidation->zeEventPoolCloseIpcHandlePrologue( hEventPool );
            if(result!=ZE_RESULT_SUCCESS) return logAndPropagateResult("zeEventPoolCloseIpcHandle", result);
        }


        if( context.enableThreadingValidation ){ 
            //Unimplemented
        }

        
        if(context.enableHandleLifetime ){
            auto result = context.handleLifetime->zeHandleLifetime.zeEventPoolCloseIpcHandlePrologue( hEventPool );
            if(result!=ZE_RESULT_SUCCESS) return logAndPropagateResult("zeEventPoolCloseIpcHandle", result);
        }

        auto driver_result = pfnCloseIpcHandle( hEventPool );

        for (size_t i = 0; i < numValHandlers; i++) {
            auto result = context.validationHandlers[i]->zeValidation->zeEventPoolCloseIpcHandleEpilogue( hEventPool ,driver_result);
            if(result!=ZE_RESULT_SUCCESS) return logAndPropagateResult("zeEventPoolCloseIpcHandle", result);
        }

        return logAndPropagateResult("zeEventPoolCloseIpcHandle", driver_result);
    }